

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O0

void __thiscall LoadTable::saveXml(LoadTable *this,ostream *s)

{
  ostream *poVar1;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  LoadTable *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  std::operator<<(s,"<loadtable");
  poVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"size",&local_39);
  a_v_i(poVar1,(string *)local_38,(long)this->size);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  poVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"num",&local_71);
  a_v_i(poVar1,(string *)local_70,(long)this->num);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::operator<<(local_18,">\n  ");
  Address::saveXml(&this->addr,local_18);
  std::operator<<(local_18,"</loadtable>\n");
  return;
}

Assistant:

void LoadTable::saveXml(ostream &s) const

{
  s << "<loadtable";
  a_v_i(s,"size",size);
  a_v_i(s,"num",num);
  s << ">\n  ";
  addr.saveXml(s);
  s << "</loadtable>\n";
}